

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O1

istream * camp::operator>>(istream *stream,Value *value)

{
  istream *piVar1;
  string str;
  undefined1 *local_70;
  long local_68;
  undefined1 local_60 [16];
  undefined1 local_50 [8];
  data_t local_48;
  Type local_20;
  
  local_68 = 0;
  local_60[0] = 0;
  local_70 = local_60;
  piVar1 = std::operator>>(stream,(string *)&local_70);
  if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) == 0) {
    local_48.align_ = (type)((long)local_50 + 0x18);
    std::__cxx11::string::_M_construct<char*>((string *)(local_50 + 8),local_70,local_70 + local_68)
    ;
    local_50._0_4_ = 4;
    local_20 = stringType;
    boost::
    variant<camp::NoType,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_camp::EnumObject,_camp::UserObject>
    ::variant_assign(&value->m_value,
                     (variant<camp::NoType,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_camp::EnumObject,_camp::UserObject>
                      *)local_50);
    value->m_type = local_20;
    boost::
    variant<camp::NoType,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_camp::EnumObject,_camp::UserObject>
    ::destroy_content((variant<camp::NoType,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_camp::EnumObject,_camp::UserObject>
                       *)local_50);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  return stream;
}

Assistant:

std::istream& operator>>(std::istream& stream, Value& value)
{
    // Use the string conversion
    std::string str;
    if (stream >> str)
        value = str;

    return stream;
}